

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::WriteBufferResetsWatchdog(AmpIO *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  bVar2 = true;
  if (uVar3 < 8) {
    uVar1 = this->WB_CURR_OFFSET;
    bVar2 = (bool)((byte)((byte)(this->WriteBuffer[uVar1 + 1] >> 0x18) |
                          (byte)(this->WriteBuffer[uVar1] >> 0x18) |
                          (byte)(this->WriteBuffer[uVar1 + 2] >> 0x18) |
                         (byte)(this->WriteBuffer[uVar1 + 3] >> 0x18)) >> 7);
  }
  return bVar2;
}

Assistant:

bool AmpIO::WriteBufferResetsWatchdog(void) const
{
    bool ret = true;
    if (GetFirmwareVersion() < 8) {
        // For Firmware versions prior to Rev 7, we must check whether any DAC valid bit
        // is set. For now, we also perform this check for Firmware Rev 7, but it could
        // be removed. Starting with Firmware Rev 7, the power control quadlet is always
        // written, so the watchdog is always reset.
        ret = (WriteBuffer[WB_CURR_OFFSET + 0] & VALID_BIT)
            | (WriteBuffer[WB_CURR_OFFSET + 1] & VALID_BIT)
            | (WriteBuffer[WB_CURR_OFFSET + 2] & VALID_BIT)
            | (WriteBuffer[WB_CURR_OFFSET + 3] & VALID_BIT);
    }
    return ret;
}